

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_current(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  LY_ERR LVar1;
  lyxp_node_type lVar2;
  lysc_node *node;
  lyd_node *node_00;
  
  if (args == (lyxp_set **)0x0 && arg_count == 0) {
    if ((options & 0x1c) == 0) {
      lyxp_set_free_content(set);
      node_00 = (set->field_10).cur_node;
      if (node_00 == (lyd_node *)0x0) {
        lVar2 = set->root_type;
        node_00 = (lyd_node *)0x0;
      }
      else {
        lVar2 = LYXP_NODE_ELEM;
      }
      set_insert_node(set,node_00,0,lVar2,0);
    }
    else {
      set_scnode_clear_ctx(set,0);
      node = (set->field_10).cur_scnode;
      if (node == (lysc_node *)0x0) {
        lVar2 = set->root_type;
        node = (lysc_node *)0x0;
      }
      else {
        lVar2 = LYXP_NODE_ELEM;
      }
      LVar1 = lyxp_set_scnode_insert_node(set,node,lVar2,LYXP_AXIS_SELF,(uint32_t *)0x0);
      if (LVar1 != LY_SUCCESS) {
        return LY_EMEM;
      }
    }
    LVar1 = LY_SUCCESS;
  }
  else {
    ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
            "Invalid number of arguments (%u) for the XPath function %.*s.",arg_count,9,"current()")
    ;
    LVar1 = LY_EVALID;
  }
  return LVar1;
}

Assistant:

static LY_ERR
xpath_current(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    if (arg_count || args) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGCOUNT, arg_count, LY_PRI_LENSTR("current()"));
        return LY_EVALID;
    }

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);

        if (set->cur_scnode) {
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, set->cur_scnode, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
        } else {
            /* root node */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, NULL, set->root_type, LYXP_AXIS_SELF, NULL));
        }
    } else {
        lyxp_set_free_content(set);

        if (set->cur_node) {
            /* position is filled later */
            set_insert_node(set, set->cur_node, 0, LYXP_NODE_ELEM, 0);
        } else {
            /* root node */
            set_insert_node(set, NULL, 0, set->root_type, 0);
        }
    }

    return LY_SUCCESS;
}